

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void unpackforblock22(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t mask;
  uint32_t *out;
  uint64_t *pw64;
  uint32_t **pout_local;
  uint8_t **pw_local;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pout;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  uVar12 = puVar1[9];
  uVar13 = puVar1[10];
  *pw = *pw + 0x58;
  *puVar2 = base + ((uint)uVar3 & 0x3fffff);
  puVar2[1] = base + ((uint)(uVar3 >> 0x16) & 0x3fffff);
  puVar2[2] = base + ((uint)(uVar3 >> 0x2c) | (uint)(uVar4 << 0x14) & 0x3fffff);
  puVar2[3] = base + ((uint)(uVar4 >> 2) & 0x3fffff);
  puVar2[4] = base + ((uint)(uVar4 >> 0x18) & 0x3fffff);
  puVar2[5] = base + ((uint)(uVar4 >> 0x2e) | (uint)(uVar5 << 0x12) & 0x3fffff);
  puVar2[6] = base + ((uint)(uVar5 >> 4) & 0x3fffff);
  puVar2[7] = base + ((uint)(uVar5 >> 0x1a) & 0x3fffff);
  puVar2[8] = base + ((uint)(ushort)(uVar5 >> 0x30) | (uint)(uVar6 << 0x10) & 0x3fffff);
  puVar2[9] = base + ((uint)(uVar6 >> 6) & 0x3fffff);
  puVar2[10] = base + ((uint)(uVar6 >> 0x1c) & 0x3fffff);
  puVar2[0xb] = base + ((uint)(uVar6 >> 0x32) | (uint)(uVar7 << 0xe) & 0x3fffff);
  puVar2[0xc] = base + ((uint)(uVar7 >> 8) & 0x3fffff);
  puVar2[0xd] = base + ((uint)(uVar7 >> 0x1e) & 0x3fffff);
  puVar2[0xe] = base + ((uint)(uVar7 >> 0x34) | (uint)(uVar8 << 0xc) & 0x3fffff);
  puVar2[0xf] = base + ((uint)(uVar8 >> 10) & 0x3fffff);
  uVar14 = (uint)(uVar8 >> 0x20);
  puVar2[0x10] = base + (uVar14 & 0x3fffff);
  puVar2[0x11] = base + (uVar14 >> 0x16 | (uint)(uVar9 << 10) & 0x3fffff);
  puVar2[0x12] = base + ((uint)(uVar9 >> 0xc) & 0x3fffff);
  puVar2[0x13] = base + ((uint)(uVar9 >> 0x22) & 0x3fffff);
  puVar2[0x14] = base + ((uint)(byte)(uVar9 >> 0x38) | (uint)(uVar10 << 8) & 0x3fffff);
  puVar2[0x15] = base + ((uint)(uVar10 >> 0xe) & 0x3fffff);
  uVar14 = (uint)(uVar10 >> 0x20);
  puVar2[0x16] = base + (uVar14 >> 4 & 0x3fffff);
  puVar2[0x17] = base + (uVar14 >> 0x1a | (uint)(uVar11 << 6) & 0x3fffff);
  puVar2[0x18] = base + ((uint)(uVar11 >> 0x10) & 0x3fffff);
  uVar14 = (uint)(uVar11 >> 0x20);
  puVar2[0x19] = base + (uVar14 >> 6 & 0x3fffff);
  puVar2[0x1a] = base + (uVar14 >> 0x1c | (uint)(uVar12 << 4) & 0x3fffff);
  puVar2[0x1b] = base + ((uint)(uVar12 >> 0x12) & 0x3fffff);
  uVar14 = (uint)(uVar12 >> 0x20);
  puVar2[0x1c] = base + (uVar14 >> 8 & 0x3fffff);
  puVar2[0x1d] = base + (uVar14 >> 0x1e | (uint)(uVar13 << 2) & 0x3fffff);
  puVar2[0x1e] = base + ((uint)(uVar13 >> 0x14) & 0x3fffff);
  puVar2[0x1f] = base + (uint)(uVar13 >> 0x2a);
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock22(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(4194303);
  /* we are going to access  11 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  *pw += 88; /* we used up 88 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 22) & mask);
  out[2] = base + (uint32_t)(((w0 >> 44) | (w1 << 20)) & mask);
  out[3] = base + (uint32_t)((w1 >> 2) & mask);
  out[4] = base + (uint32_t)((w1 >> 24) & mask);
  out[5] = base + (uint32_t)(((w1 >> 46) | (w2 << 18)) & mask);
  out[6] = base + (uint32_t)((w2 >> 4) & mask);
  out[7] = base + (uint32_t)((w2 >> 26) & mask);
  out[8] = base + (uint32_t)(((w2 >> 48) | (w3 << 16)) & mask);
  out[9] = base + (uint32_t)((w3 >> 6) & mask);
  out[10] = base + (uint32_t)((w3 >> 28) & mask);
  out[11] = base + (uint32_t)(((w3 >> 50) | (w4 << 14)) & mask);
  out[12] = base + (uint32_t)((w4 >> 8) & mask);
  out[13] = base + (uint32_t)((w4 >> 30) & mask);
  out[14] = base + (uint32_t)(((w4 >> 52) | (w5 << 12)) & mask);
  out[15] = base + (uint32_t)((w5 >> 10) & mask);
  out[16] = base + (uint32_t)((w5 >> 32) & mask);
  out[17] = base + (uint32_t)(((w5 >> 54) | (w6 << 10)) & mask);
  out[18] = base + (uint32_t)((w6 >> 12) & mask);
  out[19] = base + (uint32_t)((w6 >> 34) & mask);
  out[20] = base + (uint32_t)(((w6 >> 56) | (w7 << 8)) & mask);
  out[21] = base + (uint32_t)((w7 >> 14) & mask);
  out[22] = base + (uint32_t)((w7 >> 36) & mask);
  out[23] = base + (uint32_t)(((w7 >> 58) | (w8 << 6)) & mask);
  out[24] = base + (uint32_t)((w8 >> 16) & mask);
  out[25] = base + (uint32_t)((w8 >> 38) & mask);
  out[26] = base + (uint32_t)(((w8 >> 60) | (w9 << 4)) & mask);
  out[27] = base + (uint32_t)((w9 >> 18) & mask);
  out[28] = base + (uint32_t)((w9 >> 40) & mask);
  out[29] = base + (uint32_t)(((w9 >> 62) | (w10 << 2)) & mask);
  out[30] = base + (uint32_t)((w10 >> 20) & mask);
  out[31] = base + (uint32_t)(w10 >> 42);
  *pout += 32; /* we wrote 32 32-bit integers */
}